

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ffs_marshal.c
# Opt level: O3

void SstFFSMarshal(SstStream Stream,void *Variable,char *Name,int Type,size_t ElemSize,
                  size_t DimCount,size_t *Shape,size_t *Count,size_t *Offsets,void *Data)

{
  FMFieldList *FieldP;
  int *CountP;
  FFSMetadataInfoStruct *MBase;
  long lVar1;
  int iVar2;
  long lVar3;
  void *pvVar4;
  size_t sVar5;
  char *pcVar6;
  char *pcVar7;
  char *pcVar8;
  char *Name_00;
  char *pcVar9;
  char *__s;
  size_t *psVar10;
  void *pvVar11;
  size_t sVar12;
  long lVar13;
  long *plVar14;
  FFSWriterMarshalBase *Info;
  int *piVar15;
  ulong uVar16;
  
  piVar15 = (int *)Stream->WriterMarshalData;
  if (piVar15 == (int *)0x0) {
    InitMarshalData(Stream);
    piVar15 = (int *)Stream->WriterMarshalData;
    iVar2 = *piVar15;
  }
  else {
    iVar2 = *piVar15;
    lVar3 = (long)iVar2;
    if (0 < lVar3) {
      plVar14 = *(long **)(piVar15 + 2);
      do {
        if ((void *)*plVar14 == Variable) goto LAB_0011843f;
        plVar14 = plVar14 + 5;
        lVar3 = lVar3 + -1;
      } while (lVar3 != 0);
    }
  }
  pvVar4 = realloc(*(void **)(piVar15 + 2),(long)iVar2 * 0x28 + 0x28);
  *(void **)(piVar15 + 2) = pvVar4;
  iVar2 = *piVar15;
  plVar14 = (long *)((long)pvVar4 + (long)iVar2 * 0x28);
  *plVar14 = (long)Variable;
  *(int *)(plVar14 + 1) = iVar2;
  *(int *)(plVar14 + 4) = (int)DimCount;
  *(int *)((long)plVar14 + 0x24) = Type;
  if (DimCount == 0) {
    pcVar6 = ConcatName(Name,"");
    pcVar7 = TranslateADIOS2Type2FFS(Type);
    AddSimpleField((FMFieldList *)(piVar15 + 8),piVar15 + 6,pcVar6,pcVar7,(int)ElemSize);
    free(pcVar7);
    free(pcVar6);
    RecalcMarshalStorageSize(Stream);
    plVar14[3] = (long)*(int *)(*(long *)(piVar15 + 8) + -4 + (long)piVar15[6] * 0x18);
    plVar14[2] = -1;
  }
  else {
    sVar5 = strlen(Name);
    pcVar6 = (char *)malloc(sVar5 + 0x17);
    snprintf(pcVar6,sVar5 + 0x17,"SST%d_%d_",ElemSize,(ulong)(uint)Type);
    strcat(pcVar6,Name);
    sVar5 = strlen(pcVar6);
    builtin_strncpy(pcVar6 + sVar5,"Dims",5);
    sVar5 = strlen(Name);
    pcVar7 = (char *)malloc(sVar5 + 0x17);
    snprintf(pcVar7,sVar5 + 0x17,"SST%d_%d_",ElemSize,(ulong)(uint)Type);
    strcat(pcVar7,Name);
    sVar5 = strlen(pcVar7);
    builtin_strncpy(pcVar7 + sVar5,"DBCount",8);
    FieldP = (FMFieldList *)(piVar15 + 8);
    CountP = piVar15 + 6;
    pcVar8 = strdup("integer");
    AddSimpleField(FieldP,CountP,pcVar6,pcVar8,8);
    free(pcVar8);
    free(pcVar6);
    plVar14[3] = (long)*(int *)(*(long *)(piVar15 + 8) + -4 + (long)piVar15[6] * 0x18);
    pcVar6 = ConcatName(Name,"Shape");
    pcVar8 = ConcatName(Name,"Count");
    Name_00 = ConcatName(Name,"Offsets");
    pcVar9 = strdup("integer");
    AddSimpleField(FieldP,CountP,pcVar7,pcVar9,8);
    free(pcVar9);
    pcVar9 = strdup("integer");
    sVar5 = strlen(pcVar9);
    __s = (char *)malloc(sVar5 + 0x10);
    snprintf(__s,sVar5 + 0x10,"*(%s[%d])",pcVar9,DimCount);
    free(pcVar9);
    AddSimpleField(FieldP,CountP,pcVar6,__s,8);
    free(__s);
    *(undefined4 *)(*(long *)(piVar15 + 8) + -8 + (long)piVar15[6] * 0x18) = 8;
    AddVarArrayField(FieldP,CountP,pcVar8,4,8,pcVar7);
    AddVarArrayField(FieldP,CountP,Name_00,4,8,pcVar7);
    free(pcVar7);
    free(pcVar6);
    free(pcVar8);
    free(Name_00);
    RecalcMarshalStorageSize(Stream);
    pcVar6 = ConcatName(Name,"ElemCount");
    pcVar7 = strdup("integer");
    AddSimpleField((FMFieldList *)(piVar15 + 0xe),piVar15 + 0xc,pcVar6,pcVar7,8);
    free(pcVar7);
    plVar14[2] = (long)*(int *)(*(long *)(piVar15 + 0xe) + -4 + (long)piVar15[0xc] * 0x18);
    pcVar7 = ConcatName(Name,"");
    AddVarArrayField((FMFieldList *)(piVar15 + 0xe),piVar15 + 0xc,pcVar7,Type,(int)ElemSize,pcVar6);
    free(pcVar7);
    free(pcVar6);
    RecalcMarshalStorageSize(Stream);
    piVar15[0x10] = 0;
    piVar15[0x11] = 0;
  }
  piVar15[10] = 0;
  piVar15[0xb] = 0;
  *piVar15 = *piVar15 + 1;
LAB_0011843f:
  MBase = (FFSMetadataInfoStruct *)Stream->M;
  iVar2 = FFSBitfieldTest(MBase,(int)plVar14[1]);
  lVar3 = plVar14[1];
  uVar16 = (ulong)((int)lVar3 >> 6);
  psVar10 = MBase->BitField;
  if (MBase->BitFieldCount <= uVar16) {
    psVar10 = (size_t *)realloc(psVar10,uVar16 * 8 + 8);
    MBase->BitField = psVar10;
    memset(psVar10 + MBase->BitFieldCount,0,(uVar16 - MBase->BitFieldCount) * 8 + 8);
    MBase->BitFieldCount = uVar16 + 1;
  }
  psVar10[uVar16] = psVar10[uVar16] | 1L << ((byte)(int)lVar3 & 0x3f);
  psVar10 = (size_t *)((long)Stream->M + plVar14[3]);
  if ((int)plVar14[4] != 0) {
    pvVar4 = Stream->D;
    lVar3 = plVar14[2];
    *psVar10 = DimCount;
    if (iVar2 != 0) {
      sVar12 = psVar10[1];
      psVar10[1] = sVar12 + DimCount;
      sVar5 = (sVar12 + DimCount) * 8;
      pvVar11 = realloc((void *)psVar10[3],sVar5);
      memcpy((void *)((long)pvVar11 + sVar12 * 8),Count,DimCount * 8);
      psVar10[3] = (size_t)pvVar11;
      if (Offsets != (size_t *)0x0) {
        pvVar11 = realloc((void *)psVar10[4],sVar5);
        memcpy((void *)((long)pvVar11 + sVar12 * 8),Offsets,DimCount * 8);
        psVar10[4] = (size_t)pvVar11;
      }
      lVar13 = 1;
      if (DimCount != 0) {
        sVar12 = 0;
        do {
          lVar13 = lVar13 * Count[sVar12];
          sVar12 = sVar12 + 1;
        } while (DimCount != sVar12);
      }
      pvVar11 = realloc(*(void **)((long)pvVar4 + lVar3 + 8),
                        (*(long *)((long)pvVar4 + lVar3) + lVar13) * ElemSize);
      *(void **)((long)pvVar4 + lVar3 + 8) = pvVar11;
      lVar1 = *(long *)((long)pvVar4 + lVar3);
      memcpy((void *)(lVar1 * ElemSize + (long)pvVar11),Data,ElemSize * lVar13);
      *(long *)((long)pvVar4 + lVar3) = lVar1 + lVar13;
      return;
    }
    sVar5 = DimCount * 8;
    if (Shape == (size_t *)0x0) {
      pvVar11 = (void *)0x0;
    }
    else {
      pvVar11 = malloc(sVar5);
      memcpy(pvVar11,Shape,sVar5);
    }
    psVar10[2] = (size_t)pvVar11;
    psVar10[1] = DimCount;
    pvVar11 = malloc(sVar5);
    memcpy(pvVar11,Count,sVar5);
    psVar10[3] = (size_t)pvVar11;
    if (Offsets == (size_t *)0x0) {
      pvVar11 = (void *)0x0;
    }
    else {
      pvVar11 = malloc(sVar5);
      memcpy(pvVar11,Offsets,sVar5);
    }
    psVar10[4] = (size_t)pvVar11;
    lVar13 = 1;
    if (DimCount != 0) {
      sVar12 = 0;
      do {
        lVar13 = lVar13 * Count[sVar12];
        sVar12 = sVar12 + 1;
      } while (DimCount != sVar12);
    }
    *(long *)((long)pvVar4 + lVar3) = lVar13;
    ElemSize = ElemSize * lVar13;
    psVar10 = (size_t *)malloc(ElemSize);
    *(size_t **)((long)pvVar4 + lVar3 + 8) = psVar10;
  }
  memcpy(psVar10,Data,ElemSize);
  return;
}

Assistant:

extern void SstFFSMarshal(SstStream Stream, void *Variable, const char *Name, const int Type,
                          size_t ElemSize, size_t DimCount, const size_t *Shape,
                          const size_t *Count, const size_t *Offsets, const void *Data)
{

    struct FFSMetadataInfoStruct *MBase;

    FFSWriterRec Rec = LookupWriterRec(Stream, Variable);
    if (!Rec)
    {
        Rec = CreateWriterRec(Stream, Variable, Name, Type, ElemSize, DimCount);
    }

    MBase = Stream->M;
    int AlreadyWritten = FFSBitfieldTest(MBase, Rec->FieldID);
    FFSBitfieldSet(MBase, Rec->FieldID);

    if (Rec->DimCount == 0)
    {
        memcpy((char *)(Stream->M) + Rec->MetaOffset, Data, ElemSize);
    }
    else
    {
        MetaArrayRec *MetaEntry = (MetaArrayRec *)((char *)(Stream->M) + Rec->MetaOffset);
        ArrayRec *DataEntry = (ArrayRec *)((char *)(Stream->D) + Rec->DataOffset);

        /* handle metadata */
        MetaEntry->Dims = DimCount;
        if (!AlreadyWritten)
        {
            if (Shape)
                MetaEntry->Shape = CopyDims(DimCount, Shape);
            else
                MetaEntry->Shape = NULL;
            MetaEntry->DBCount = DimCount;
            MetaEntry->Count = CopyDims(DimCount, Count);
            if (Offsets)
                MetaEntry->Offsets = CopyDims(DimCount, Offsets);
            else
                MetaEntry->Offsets = NULL;
        }
        else
        {
            /* already got some metadata, add blocks */
            size_t PreviousDBCount = MetaEntry->DBCount;
            //  Assume shape is still valid   (modify this if shape /global
            //  dimensions can change )
            // Also assume Dims is always right and consistent, otherwise, bad
            // things
            MetaEntry->DBCount += DimCount;
            MetaEntry->Count = AppendDims(MetaEntry->Count, PreviousDBCount, DimCount, Count);
            if (Offsets)
                MetaEntry->Offsets =
                    AppendDims(MetaEntry->Offsets, PreviousDBCount, DimCount, Offsets);
        }

        if ((Stream->ConfigParams->CompressionMethod == SstCompressZFP) &&
            ZFPcompressionPossible(Type, DimCount))
        {
#ifdef ADIOS2_HAVE_ZFP
            /* this should never be true if ZFP is not available */
            size_t ByteCount;
            char *Output =
                FFS_ZFPCompress(Stream, Rec->DimCount, Rec->Type, (void *)Data, Count, &ByteCount);
            DataEntry->ElemCount = ByteCount;
            DataEntry->Array = Output;
#endif
        }
        else
        {
            if (!AlreadyWritten)
            {
                /* normal array case */
                size_t ElemCount = CalcSize(DimCount, Count);
                DataEntry->ElemCount = ElemCount;
                /* this is PutSync case, so we have to copy the data NOW */
                DataEntry->Array = malloc(ElemCount * ElemSize);
                memcpy(DataEntry->Array, Data, ElemCount * ElemSize);
            }
            else
            {
                size_t ElemCount = CalcSize(DimCount, Count);
                /* this is PutSync case, so we have to copy the data NOW */
                DataEntry->Array =
                    realloc(DataEntry->Array, (DataEntry->ElemCount + ElemCount) * ElemSize);
                memcpy((char *)DataEntry->Array + DataEntry->ElemCount * ElemSize, Data,
                       ElemCount * ElemSize);
                DataEntry->ElemCount += ElemCount;
            }
        }
    }
}